

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

void testing::internal::PrintStringTo(string *s,ostream *os)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  char *pcVar4;
  ulong uVar5;
  CharFormat CVar6;
  int iVar7;
  ulong uVar8;
  ostream *poVar9;
  size_t i;
  ulong uVar10;
  
  CVar6 = PrintCharsAsStringTo<char>((s->_M_dataplus)._M_p,s->_M_string_length,os);
  if ((CVar6 != kAsIs) && (FLAGS_gtest_print_utf8 == '\x01')) {
    pcVar4 = (s->_M_dataplus)._M_p;
    uVar5 = s->_M_string_length;
    for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
      bVar2 = pcVar4[uVar10];
      iVar7 = iscntrl((uint)bVar2);
      if (iVar7 != 0) {
        if (0xd < bVar2) {
          return;
        }
        if ((0x2600U >> (bVar2 & 0x1f) & 1) == 0) {
          return;
        }
      }
    }
    uVar10 = 0;
    do {
      while( true ) {
        while( true ) {
          do {
            do {
              uVar8 = uVar10;
              if (uVar5 <= uVar8) {
                poVar9 = std::operator<<(os,"\n    As Text: \"");
                poVar9 = std::operator<<(poVar9,pcVar4);
                std::operator<<(poVar9,"\"");
                return;
              }
              uVar1 = uVar8 + 1;
              bVar2 = pcVar4[uVar8];
              uVar10 = uVar1;
            } while (-1 < (char)bVar2);
            if (bVar2 < 0xc2) {
              return;
            }
          } while (((bVar2 < 0xe0) && (uVar8 + 2 <= uVar5)) &&
                  (uVar10 = uVar8 + 2, pcVar4[uVar1] < -0x40));
          if ((bVar2 & 0xf0) != 0xe0) break;
          uVar10 = uVar8 + 3;
          if (uVar5 < uVar10) {
            return;
          }
          bVar3 = pcVar4[uVar1];
          if (-0x41 < (char)bVar3) {
            return;
          }
          if (-0x41 < pcVar4[uVar8 + 2]) {
            return;
          }
          if (bVar2 == 0xed) {
            if (0x9f < bVar3) {
              return;
            }
          }
          else if ((bVar2 == 0xe0) && (bVar3 < 0xa0)) {
            return;
          }
        }
        if (4 < (byte)(bVar2 + 0x10)) {
          return;
        }
        uVar10 = uVar8 + 4;
        if (uVar5 < uVar10) {
          return;
        }
        bVar3 = pcVar4[uVar1];
        if (-0x41 < (char)bVar3) {
          return;
        }
        if (-0x41 < pcVar4[uVar8 + 2]) {
          return;
        }
        if (-0x41 < pcVar4[uVar8 + 3]) {
          return;
        }
        if (bVar2 == 0xf4) break;
        if ((bVar2 == 0xf0) && (bVar3 < 0x90)) {
          return;
        }
      }
    } while (bVar3 < 0x90);
  }
  return;
}

Assistant:

void PrintStringTo(const ::std::string& s, ostream* os) {
  if (PrintCharsAsStringTo(s.data(), s.size(), os) == kHexEscape) {
    if (GTEST_FLAG_GET(print_utf8)) {
      ConditionalPrintAsText(s.data(), s.size(), os);
    }
  }
}